

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_table_entry.cpp
# Opt level: O2

void __thiscall
duckdb::DuckTableEntry::UndoAlter(DuckTableEntry *this,ClientContext *context,AlterInfo *info)

{
  DataTable *this_00;
  string sStack_38;
  
  if (info->field_0x71 == '\x02') {
    this_00 = shared_ptr<duckdb::DataTable,_true>::operator->(&this->storage);
    ::std::__cxx11::string::string
              ((string *)&sStack_38,
               (string *)
               &(this->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.
                super_CatalogEntry.name);
    DataTable::SetTableName(this_00,&sStack_38);
    ::std::__cxx11::string::~string((string *)&sStack_38);
  }
  return;
}

Assistant:

void DuckTableEntry::UndoAlter(ClientContext &context, AlterInfo &info) {
	D_ASSERT(!internal);
	D_ASSERT(info.type == AlterType::ALTER_TABLE);
	auto &table_info = info.Cast<AlterTableInfo>();
	switch (table_info.alter_table_type) {
	case AlterTableType::RENAME_TABLE: {
		storage->SetTableName(this->name);
		break;
	default:
		break;
	}
	}
}